

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_ptr_test.cpp
# Opt level: O3

void __thiscall
unique_ptr_reset_ptr_Test::~unique_ptr_reset_ptr_Test(unique_ptr_reset_ptr_Test *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  testing::Test::~Test(&this->super_Test);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x10);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(unique_ptr, reset_ptr)
{
    // Create an empty (ie. NULL) unique_ptr
    unique_ptr<Struct2> xPtr;

    // Reset it with a new pointer
    xPtr.reset(new Struct2(123));

    EXPECT_EQ(true, xPtr);
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,  xPtr->mVal);
    EXPECT_EQ(1,    Struct2::_mNbInstances);
    Struct2* pX  = xPtr.get();

    // Reset it with another new pointer
    xPtr.reset(new Struct2(234));

    EXPECT_EQ(true, xPtr);
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(234,  xPtr->mVal);
    EXPECT_EQ(1,    Struct2::_mNbInstances);
    EXPECT_NE(pX,   xPtr.get());

    // Copy-construct a new unique_ptr to the same object, transferring ownership
    unique_ptr<Struct2> yPtr(xPtr);

    EXPECT_NE(xPtr,  yPtr);
    EXPECT_EQ(false,  xPtr);
    EXPECT_EQ((void*)NULL,  xPtr.get());
    EXPECT_EQ(true,  yPtr);
    EXPECT_NE((void*)NULL,  yPtr.get());
    EXPECT_EQ(234,   yPtr->mVal);
    EXPECT_EQ(1,     Struct2::_mNbInstances);

    // Reset to NULL
    yPtr.reset();

    EXPECT_EQ((void*)NULL,  yPtr.get());
    EXPECT_EQ(false, xPtr);
    EXPECT_EQ((void*)NULL,  xPtr.get());
    EXPECT_EQ(0,     Struct2::_mNbInstances);
}